

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O1

int init_socket_suff(s_SocketStuff *s,char *text_addr,int ip_version)

{
  socklen_t sVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int *piVar4;
  sa_family_t sVar5;
  long lVar6;
  char *FmtStr;
  int reuseaddr_on;
  int onOff;
  char errorBuffer [256];
  undefined4 local_130;
  undefined4 local_12c;
  undefined1 local_128 [264];
  
  local_130 = 1;
  memset(s,0,0xa8);
  s->fd = -1;
  s->ip_version = ip_version;
  s->text_addr = text_addr;
  (s->field_3).serverAddr = (sockaddr *)&s->ss;
  if (ip_version == 4) {
    iVar3 = 2;
    lVar6 = 0x14;
    sVar1 = 0x10;
    sVar5 = 2;
LAB_00114216:
    (s->ss).ss_family = sVar5;
    s->address_len = sVar1;
    iVar2 = inet_pton(iVar3,text_addr,(s->ss).__ss_padding + lVar6 + -0x12);
    if (iVar2 < 1) goto LAB_001143aa;
    iVar3 = socket(iVar3,1,0);
    s->fd = iVar3;
    if (iVar3 != -1) {
      if (ip_version == 6) {
        local_12c = 1;
        iVar3 = setsockopt(iVar3,0x29,0x1a,&local_12c,4);
        iVar2 = 0;
        if (iVar3 == -1) {
          piVar4 = __errno_location();
          __xpg_strerror_r(*piVar4,local_128,0x100);
          UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x32e,
                     "init_socket_suff(): unable to set IPv6 socket protocol: %s\n",local_128);
          iVar2 = 3;
          iVar3 = extraout_EAX;
        }
        if (iVar2 == 3) goto LAB_001143aa;
        if (iVar2 != 0) {
          return iVar3;
        }
      }
      iVar3 = setsockopt(s->fd,1,2,&local_130,4);
      if (iVar3 != -1) {
        return 0;
      }
      piVar4 = __errno_location();
      __xpg_strerror_r(*piVar4,local_128,0x100);
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x345,
                 "init_socket_suff(): unable to set SO_REUSEADDR: %s\n",local_128);
      goto LAB_001143aa;
    }
    piVar4 = __errno_location();
    __xpg_strerror_r(*piVar4,local_128,0x100);
    FmtStr = "init_socket_suff(): IPv%c socket not available: %s\n";
    iVar3 = 0x31b;
  }
  else {
    if (ip_version == 6) {
      iVar3 = 10;
      lVar6 = 0x18;
      sVar1 = 0x1c;
      sVar5 = 10;
      goto LAB_00114216;
    }
    FmtStr = "init_socket_suff(): Invalid IP version: %d.\n";
    iVar3 = 0x30b;
  }
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",iVar3,FmtStr,
             (ulong)(uint)ip_version);
LAB_001143aa:
  if (s->fd != -1) {
    close(s->fd);
  }
  s->fd = -1;
  return 1;
}

Assistant:

static int init_socket_suff(
	struct s_SocketStuff *s, const char *text_addr, int ip_version)
{
	char errorBuffer[ERROR_BUFFER_LEN];
	int sockError;
	sa_family_t domain;
	void *addr;
	int reuseaddr_on = MINISERVER_REUSEADDR;

	memset(s, 0, sizeof *s);
	s->fd = INVALID_SOCKET;
	s->ip_version = ip_version;
	s->text_addr = text_addr;
	s->serverAddr = (struct sockaddr *)&s->ss;
	switch (ip_version) {
	case 4:
		domain = AF_INET;
		s->serverAddr4->sin_family = domain;
		s->address_len = sizeof *s->serverAddr4;
		addr = &s->serverAddr4->sin_addr;
		break;
	case 6:
		if (!ENABLE_IPV6) {
			goto ok;
		}
		domain = AF_INET6;
		s->serverAddr6->sin6_family = domain;
		s->address_len = sizeof *s->serverAddr6;
		addr = &s->serverAddr6->sin6_addr;
		break;
	default:
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"init_socket_suff(): Invalid IP version: %d.\n",
			ip_version);
		goto error;
		break;
	}

	if (inet_pton(domain, text_addr, addr) <= 0)
		goto error;

	s->fd = socket(domain, SOCK_STREAM, 0);
	if (s->fd == INVALID_SOCKET) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"init_socket_suff(): IPv%c socket not available: "
			"%s\n",
			ip_version,
			errorBuffer);
		goto error;
	} else if (ip_version == 6) {
		int onOff = 1;

		sockError = setsockopt(s->fd,
			IPPROTO_IPV6,
			IPV6_V6ONLY,
			(char *)&onOff,
			sizeof(onOff));
		if (sockError == SOCKET_ERROR) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"init_socket_suff(): unable to set IPv6 "
				"socket protocol: %s\n",
				errorBuffer);
			goto error;
		}
	}
	/* Getting away with implementation of re-using address:port and
	 * instead choosing to increment port numbers.
	 * Keeping the re-use address code as an optional behaviour that
	 * can be turned on if necessary.
	 * TURN ON the reuseaddr_on option to use the option. */
	if (MINISERVER_REUSEADDR) {
		sockError = setsockopt(s->fd,
			SOL_SOCKET,
			SO_REUSEADDR,
			(const char *)&reuseaddr_on,
			sizeof(int));
		if (sockError == SOCKET_ERROR) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"init_socket_suff(): unable to set "
				"SO_REUSEADDR: %s\n",
				errorBuffer);
			goto error;
		}
	}
ok:
	return 0;

error:
	if (s->fd != INVALID_SOCKET) {
		sock_close(s->fd);
	}
	s->fd = INVALID_SOCKET;

	return 1;
}